

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3AppendToNode(Blob *pNode,Blob *pPrev,char *zTerm,int nTerm,char *aDoclist,int nDoclist)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int rc;
  int local_34;
  
  local_34 = 0;
  iVar5 = pPrev->n;
  blobGrowBuffer(pPrev,nTerm,&local_34);
  if (local_34 == 0) {
    uVar1 = pPrev->n;
    uVar9 = 0;
    if (0 < (int)uVar1) {
      do {
        if (pPrev->a[uVar9] != zTerm[uVar9]) goto LAB_001c527a;
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
      uVar9 = (ulong)uVar1;
    }
LAB_001c527a:
    iVar8 = (int)uVar9;
    iVar10 = nTerm - iVar8;
    memcpy(pPrev->a,zTerm,(long)nTerm);
    pPrev->n = nTerm;
    if (iVar5 == 0) {
      iVar5 = pNode->n;
    }
    else {
      iVar5 = pNode->n;
      pcVar2 = pNode->a;
      lVar6 = 0;
      uVar9 = (long)iVar8;
      do {
        bVar4 = (byte)uVar9;
        pcVar2[lVar6 + iVar5] = bVar4 | 0x80;
        lVar6 = lVar6 + 1;
        bVar3 = 0x7f < uVar9;
        uVar9 = uVar9 >> 7;
      } while (bVar3);
      pcVar2[lVar6 + (long)iVar5 + -1] = bVar4;
      iVar5 = (int)lVar6 + pNode->n;
      pNode->n = iVar5;
    }
    pcVar2 = pNode->a;
    lVar6 = 0;
    sVar7 = (long)iVar10;
    do {
      bVar4 = (byte)sVar7;
      pcVar2[lVar6 + iVar5] = bVar4 | 0x80;
      lVar6 = lVar6 + 1;
      bVar3 = 0x7f < sVar7;
      sVar7 = sVar7 >> 7;
    } while (bVar3);
    pcVar2[lVar6 + (long)iVar5 + -1] = bVar4;
    iVar5 = (int)lVar6 + pNode->n;
    pNode->n = iVar5;
    memcpy(pNode->a + iVar5,zTerm + iVar8,(long)iVar10);
    iVar10 = iVar10 + pNode->n;
    pNode->n = iVar10;
    if (aDoclist != (char *)0x0) {
      pcVar2 = pNode->a;
      lVar6 = 0;
      sVar7 = (long)nDoclist;
      do {
        bVar4 = (byte)sVar7;
        pcVar2[lVar6 + iVar10] = bVar4 | 0x80;
        lVar6 = lVar6 + 1;
        bVar3 = 0x7f < sVar7;
        sVar7 = sVar7 >> 7;
      } while (bVar3);
      pcVar2[lVar6 + (long)iVar10 + -1] = bVar4;
      iVar5 = (int)lVar6 + pNode->n;
      pNode->n = iVar5;
      memcpy(pNode->a + iVar5,aDoclist,(long)nDoclist);
      pNode->n = pNode->n + nDoclist;
    }
    local_34 = 0;
  }
  return local_34;
}

Assistant:

static int fts3AppendToNode(
  Blob *pNode,                    /* Current node image to append to */
  Blob *pPrev,                    /* Buffer containing previous term written */
  const char *zTerm,              /* New term to write */
  int nTerm,                      /* Size of zTerm in bytes */
  const char *aDoclist,           /* Doclist (or NULL) to write */
  int nDoclist                    /* Size of aDoclist in bytes */ 
){
  int rc = SQLITE_OK;             /* Return code */
  int bFirst = (pPrev->n==0);     /* True if this is the first term written */
  int nPrefix;                    /* Size of term prefix in bytes */
  int nSuffix;                    /* Size of term suffix in bytes */

  /* Node must have already been started. There must be a doclist for a
  ** leaf node, and there must not be a doclist for an internal node.  */
  assert( pNode->n>0 );
  assert( (pNode->a[0]=='\0')==(aDoclist!=0) );

  blobGrowBuffer(pPrev, nTerm, &rc);
  if( rc!=SQLITE_OK ) return rc;

  nPrefix = fts3PrefixCompress(pPrev->a, pPrev->n, zTerm, nTerm);
  nSuffix = nTerm - nPrefix;
  memcpy(pPrev->a, zTerm, nTerm);
  pPrev->n = nTerm;

  if( bFirst==0 ){
    pNode->n += sqlite3Fts3PutVarint(&pNode->a[pNode->n], nPrefix);
  }
  pNode->n += sqlite3Fts3PutVarint(&pNode->a[pNode->n], nSuffix);
  memcpy(&pNode->a[pNode->n], &zTerm[nPrefix], nSuffix);
  pNode->n += nSuffix;

  if( aDoclist ){
    pNode->n += sqlite3Fts3PutVarint(&pNode->a[pNode->n], nDoclist);
    memcpy(&pNode->a[pNode->n], aDoclist, nDoclist);
    pNode->n += nDoclist;
  }

  assert( pNode->n<=pNode->nAlloc );

  return SQLITE_OK;
}